

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

Type ON_ModelComponent::ComponentTypeFromUnsigned(uint component_type_as_unsigned)

{
  Type TVar1;
  
  switch(component_type_as_unsigned) {
  case 0:
    TVar1 = Unset;
    break;
  case 1:
    TVar1 = Image;
    break;
  case 2:
    TVar1 = TextureMapping;
    break;
  case 3:
    TVar1 = Material;
    break;
  case 4:
    TVar1 = LinePattern;
    break;
  case 5:
    TVar1 = Layer;
    break;
  case 6:
    TVar1 = Group;
    break;
  case 7:
    TVar1 = TextStyle;
    break;
  case 8:
    TVar1 = DimStyle;
    break;
  case 9:
    TVar1 = RenderLight;
    break;
  case 10:
    TVar1 = HatchPattern;
    break;
  case 0xb:
    TVar1 = InstanceDefinition;
    break;
  case 0xc:
    TVar1 = ModelGeometry;
    break;
  case 0xd:
    TVar1 = HistoryRecord;
    break;
  case 0xe:
    TVar1 = RenderContent;
    break;
  case 0xf:
    TVar1 = EmbeddedFile;
    break;
  case 0x10:
    TVar1 = ObsoleteValue;
    break;
  case 0x11:
    TVar1 = SectionStyle;
    break;
  default:
    if (component_type_as_unsigned == 0xfe) {
      TVar1 = Mixed;
    }
    else {
      TVar1 = Unset;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x155,"","component_type_as_unsigned has invalid value.");
    }
  }
  return TVar1;
}

Assistant:

ON_ModelComponent::Type ON_ModelComponent::ComponentTypeFromUnsigned(
  unsigned int component_type_as_unsigned
  )
{
  switch (component_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Image);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::TextureMapping);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Material);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::LinePattern);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Layer);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Group);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::TextStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::DimStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::RenderLight);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::HatchPattern);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::InstanceDefinition);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::ModelGeometry);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::HistoryRecord);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::RenderContent);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::EmbeddedFile);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::ObsoleteValue);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::SectionStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Mixed);
  }

  ON_ERROR("component_type_as_unsigned has invalid value.");
  return ON_ModelComponent::Type::Unset;
}